

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O0

string * __thiscall
bssl::CertErrors::ToDebugString_abi_cxx11_(string *__return_storage_ptr__,CertErrors *this)

{
  bool bVar1;
  string local_60;
  reference local_40;
  CertError *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bssl::CertError,_std::allocator<bssl::CertError>_> *__range1;
  CertErrors *this_local;
  string *result;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = ::std::vector<bssl::CertError,_std::allocator<bssl::CertError>_>::begin(&this->nodes_);
  node = (CertError *)
         ::std::vector<bssl::CertError,_std::allocator<bssl::CertError>_>::end(&this->nodes_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_bssl::CertError_*,_std::vector<bssl::CertError,_std::allocator<bssl::CertError>_>_>
                                     *)&node), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_bssl::CertError_*,_std::vector<bssl::CertError,_std::allocator<bssl::CertError>_>_>
               ::operator*(&__end1);
    CertError::ToDebugString_abi_cxx11_(&local_60,local_40);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    __gnu_cxx::
    __normal_iterator<const_bssl::CertError_*,_std::vector<bssl::CertError,_std::allocator<bssl::CertError>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CertErrors::ToDebugString() const {
  std::string result;
  for (const CertError &node : nodes_) {
    result += node.ToDebugString();
  }

  return result;
}